

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O3

bool __thiscall irr::gui::CGUIEnvironment::removeFocus(CGUIEnvironment *this,IGUIElement *element)

{
  code *pcVar1;
  _func_int *p_Var2;
  int iVar3;
  IGUIElement *pIVar4;
  SEvent e;
  
  pIVar4 = this->Focus;
  if (pIVar4 == element && pIVar4 != (IGUIElement *)0x0) {
    iVar3 = (*(pIVar4->super_IEventReceiver)._vptr_IEventReceiver[2])();
    if ((char)iVar3 != '\0') {
      return false;
    }
    pIVar4 = this->Focus;
  }
  if (pIVar4 != (IGUIElement *)0x0) {
    p_Var2 = (pIVar4->super_IEventReceiver)._vptr_IEventReceiver[-3];
    pcVar1 = p_Var2 + 8 +
             (long)&(pIVar4->Children).
                    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
    ;
    *(int *)pcVar1 = *(int *)pcVar1 + -1;
    if (*(int *)pcVar1 == 0) {
      (**(code **)(*(long *)(p_Var2 + (long)&(pIVar4->super_IEventReceiver)._vptr_IEventReceiver) +
                  8))();
    }
    this->Focus = (IGUIElement *)0x0;
  }
  return true;
}

Assistant:

bool CGUIEnvironment::removeFocus(IGUIElement *element)
{
	if (Focus && Focus == element) {
		SEvent e;
		e.EventType = EET_GUI_EVENT;
		e.GUIEvent.Caller = Focus;
		e.GUIEvent.Element = 0;
		e.GUIEvent.EventType = EGET_ELEMENT_FOCUS_LOST;
		if (Focus->OnEvent(e)) {
			return false;
		}
	}
	if (Focus) {
		Focus->drop();
		Focus = 0;
	}

	return true;
}